

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::format_system_error(buffer<char> *out,int error_code,string_view message)

{
  ulong uVar1;
  int iVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R8;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  string_view message_00;
  undefined **local_290;
  char *local_288;
  size_t local_280;
  ulong local_278;
  char local_270 [504];
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_50;
  char *system_message;
  char *local_40;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_38;
  buffer<char> *buf;
  
  system_message = (char *)message.size_;
  local_40 = message.data_;
  local_288 = local_270;
  local_290 = &PTR_grow_002b1bd8;
  local_278 = 500;
  local_280 = 500;
  local_38.container = out;
  while (local_50 = local_288, iVar2 = detail::safe_strerror(error_code,&local_50,local_280),
        iVar2 == 0x22) {
    uVar1 = local_280 * 2;
    if (local_278 < uVar1) {
      (*(code *)*local_290)(&local_290,uVar1);
    }
    local_280 = uVar1;
    if (local_278 < uVar1) {
      local_280 = local_278;
    }
  }
  if (iVar2 == 0) {
    in_R8.values_ =
         (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
         &local_78;
    local_78 = local_40;
    local_70 = system_message;
    local_68 = local_50;
    format_str.size_ = 6;
    format_str.data_ = "{}: {}";
    args.field_1.values_ = in_R8.values_;
    args.desc_ = 0xcd;
    vformat_to<fmt::v7::detail::arg_formatter<fmt::v7::detail::buffer_appender<char>,char>,char,fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>
              ((iterator)local_38.container,format_str,args,(locale_ref)0x0);
  }
  local_290 = &PTR_grow_002b1bd8;
  if (local_288 != local_270) {
    operator_delete(local_288,local_278);
  }
  if (iVar2 != 0) {
    message_00.size_ = (size_t)in_R8.values_;
    message_00.data_ = system_message;
    detail::format_error_code
              ((detail *)local_38.container,(buffer<char> *)(ulong)(uint)error_code,(int)local_40,
               message_00);
  }
  return;
}

Assistant:

FMT_FUNC void format_system_error(detail::buffer<char>& out, int error_code,
                                  string_view message) FMT_NOEXCEPT {
  FMT_TRY {
    memory_buffer buf;
    buf.resize(inline_buffer_size);
    for (;;) {
      char* system_message = &buf[0];
      int result =
          detail::safe_strerror(error_code, system_message, buf.size());
      if (result == 0) {
        format_to(detail::buffer_appender<char>(out), "{}: {}", message,
                  system_message);
        return;
      }
      if (result != ERANGE)
        break;  // Can't get error message, report error code instead.
      buf.resize(buf.size() * 2);
    }
  }